

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepScanLineInputFile::Data::prepFillList
          (Data *this,DeepFrameBuffer *fb,
          vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *fill)

{
  int iVar1;
  bool bVar2;
  Slice *pSVar3;
  undefined8 uVar4;
  exr_attr_chlist_entry_t *peVar5;
  DeepSlice *pDVar6;
  ostream *poVar7;
  char *pcVar8;
  stringstream *text;
  DeepFrameBuffer *in_RSI;
  stringstream _iex_throw_s;
  exr_attr_chlist_entry_t *curc;
  ConstIterator j;
  Slice *sampleCountSlice;
  DeepFrameBuffer *in_stack_fffffffffffffdc8;
  ArgExc *in_stack_fffffffffffffdd0;
  value_type *in_stack_fffffffffffffdd8;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *in_stack_fffffffffffffde0;
  Context *in_stack_fffffffffffffde8;
  stringstream local_1d0 [16];
  ostream local_1c0 [304];
  Context *in_stack_ffffffffffffff70;
  
  pSVar3 = DeepFrameBuffer::getSampleCountSlice(in_RSI);
  std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::clear
            ((vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)0x1791de);
  if (pSVar3->base == (char *)0x0) {
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  DeepFrameBuffer::begin(in_stack_fffffffffffffdc8);
  do {
    DeepFrameBuffer::end(in_stack_fffffffffffffdc8);
    bVar2 = Imf_3_3::operator!=((ConstIterator *)in_stack_fffffffffffffdd0,
                                (ConstIterator *)in_stack_fffffffffffffdc8);
    if (!bVar2) {
      return;
    }
    DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1792b4);
    peVar5 = Context::findChannel
                       (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                        (char *)in_stack_fffffffffffffdd8);
    if (peVar5 == (exr_attr_chlist_entry_t *)0x0) {
      DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1792f2);
      std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::push_back
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
    else {
      iVar1 = peVar5->x_sampling;
      pDVar6 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x179320);
      if ((iVar1 != (pDVar6->super_Slice).xSampling) ||
         (iVar1 = peVar5->y_sampling,
         pDVar6 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x179348),
         iVar1 != (pDVar6->super_Slice).ySampling)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1d0);
        poVar7 = std::operator<<(local_1c0,"X and/or y subsampling factors of \"");
        pcVar8 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x17938e);
        poVar7 = std::operator<<(poVar7,pcVar8);
        poVar7 = std::operator<<(poVar7,"\" channel of input file \"");
        pcVar8 = Context::fileName(in_stack_ffffffffffffff70);
        poVar7 = std::operator<<(poVar7,pcVar8);
        std::operator<<(poVar7,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        text = (stringstream *)__cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar7,text);
        __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    DeepFrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffdd0);
  } while( true );
}

Assistant:

void DeepScanLineInputFile::Data::prepFillList (
    const DeepFrameBuffer &fb, std::vector<DeepSlice> &fill)
{
    const Slice& sampleCountSlice = fb.getSampleCountSlice ();

    fill.clear ();

    if (!sampleCountSlice.base)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }

    for (DeepFrameBuffer::ConstIterator j = fb.begin (); j != fb.end (); ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt->findChannel (
            partNumber, j.name ());

        if (!curc)
        {
            fill.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << _ctxt->fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }
}